

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtptcptransmitter.cpp
# Opt level: O0

void __thiscall jrtplib::RTPTCPTransmitter::~RTPTCPTransmitter(RTPTCPTransmitter *this)

{
  RTPTCPTransmitter *this_local;
  
  (this->super_RTPTransmitter).super_RTPMemoryObject._vptr_RTPMemoryObject =
       (_func_int **)&PTR__RTPTCPTransmitter_001925e0;
  (*(this->super_RTPTransmitter).super_RTPMemoryObject._vptr_RTPMemoryObject[4])();
  RTPAbortDescriptors::~RTPAbortDescriptors(&this->m_abortDesc);
  std::__cxx11::list<jrtplib::RTPRawPacket_*,_std::allocator<jrtplib::RTPRawPacket_*>_>::~list
            (&this->m_rawpacketlist);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&this->m_localHostname);
  std::vector<signed_char,_std::allocator<signed_char>_>::~vector(&this->m_tmpFlags);
  std::vector<int,_std::allocator<int>_>::~vector(&this->m_tmpSocks);
  std::
  map<int,_jrtplib::RTPTCPTransmitter::SocketData,_std::less<int>,_std::allocator<std::pair<const_int,_jrtplib::RTPTCPTransmitter::SocketData>_>_>
  ::~map(&this->m_destSockets);
  RTPTransmitter::~RTPTransmitter(&this->super_RTPTransmitter);
  return;
}

Assistant:

RTPTCPTransmitter::~RTPTCPTransmitter()
{
	Destroy();
}